

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnvironmentalProcessPdu.cpp
# Opt level: O2

void __thiscall
DIS::EnvironmentalProcessPdu::unmarshal(EnvironmentalProcessPdu *this,DataStream *dataStream)

{
  ulong uVar1;
  Environment x;
  Environment local_40;
  
  SyntheticEnvironmentFamilyPdu::unmarshal(&this->super_SyntheticEnvironmentFamilyPdu,dataStream);
  EntityID::unmarshal(&this->_environementalProcessID,dataStream);
  EntityType::unmarshal(&this->_environmentType,dataStream);
  DataStream::operator>>(dataStream,&this->_modelType);
  DataStream::operator>>(dataStream,&this->_environmentStatus);
  DataStream::operator>>(dataStream,&this->_numberOfEnvironmentRecords);
  DataStream::operator>>(dataStream,&this->_sequenceNumber);
  std::vector<DIS::Environment,_std::allocator<DIS::Environment>_>::clear
            (&this->_environmentRecords);
  for (uVar1 = 0; uVar1 < this->_numberOfEnvironmentRecords; uVar1 = uVar1 + 1) {
    Environment::Environment(&local_40);
    Environment::unmarshal(&local_40,dataStream);
    std::vector<DIS::Environment,_std::allocator<DIS::Environment>_>::push_back
              (&this->_environmentRecords,&local_40);
    Environment::~Environment(&local_40);
  }
  return;
}

Assistant:

void EnvironmentalProcessPdu::unmarshal(DataStream& dataStream)
{
    SyntheticEnvironmentFamilyPdu::unmarshal(dataStream); // unmarshal information in superclass first
    _environementalProcessID.unmarshal(dataStream);
    _environmentType.unmarshal(dataStream);
    dataStream >> _modelType;
    dataStream >> _environmentStatus;
    dataStream >> _numberOfEnvironmentRecords;
    dataStream >> _sequenceNumber;

     _environmentRecords.clear();
     for(size_t idx = 0; idx < _numberOfEnvironmentRecords; idx++)
     {
        Environment x;
        x.unmarshal(dataStream);
        _environmentRecords.push_back(x);
     }
}